

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

void cJSON_Minify(char *json)

{
  char *pcVar1;
  char *pcVar2;
  bool bVar3;
  char *local_18;
  char *into;
  char *json_local;
  
  local_18 = json;
  into = json;
  while (*into != '\0') {
    if (*into == ' ') {
      into = into + 1;
    }
    else if (*into == '\t') {
      into = into + 1;
    }
    else if (*into == '\r') {
      into = into + 1;
    }
    else if (*into == '\n') {
      into = into + 1;
    }
    else if ((*into == '/') && (into[1] == '/')) {
      while( true ) {
        bVar3 = false;
        if (*into != '\0') {
          bVar3 = *into != '\n';
        }
        if (!bVar3) break;
        into = into + 1;
      }
    }
    else if ((*into == '/') && (into[1] == '*')) {
      while( true ) {
        bVar3 = false;
        if (*into != '\0') {
          bVar3 = false;
          if (*into == '*') {
            bVar3 = into[1] == '/';
          }
          bVar3 = (bool)(bVar3 ^ 1);
        }
        if (!bVar3) break;
        into = into + 1;
      }
      into = into + 2;
    }
    else if (*into == '\"') {
      *local_18 = *into;
      pcVar1 = local_18;
      pcVar2 = into;
      while( true ) {
        into = pcVar2 + 1;
        local_18 = pcVar1 + 1;
        bVar3 = false;
        if (*into != '\0') {
          bVar3 = *into != '\"';
        }
        if (!bVar3) break;
        if (*into == '\\') {
          *local_18 = *into;
          local_18 = pcVar1 + 2;
          into = pcVar2 + 2;
        }
        *local_18 = *into;
        pcVar1 = local_18;
        pcVar2 = into;
      }
      *local_18 = *into;
      local_18 = pcVar1 + 2;
      into = pcVar2 + 2;
    }
    else {
      *local_18 = *into;
      local_18 = local_18 + 1;
      into = into + 1;
    }
  }
  *local_18 = '\0';
  return;
}

Assistant:

void
cJSON_Minify(char *json)
{
    char *into = json;
    while (*json) {
        if (*json == ' ')
            json++;
        else if (*json == '\t')
            json++; // Whitespace characters.
        else if (*json == '\r')
            json++;
        else if (*json == '\n')
            json++;
        else if (*json == '/' && json[1] == '/')
            while (*json && *json != '\n')
                json++; // double-slash comments, to end of line.
        else if (*json == '/' && json[1] == '*') {
            while (*json && !(*json == '*' && json[1] == '/'))
                json++;
            json += 2;
        } // multiline comments.
        else if (*json == '\"') {
            *into++ = *json++;
            while (*json && *json != '\"') {
                if (*json == '\\')
                    *into++ = *json++;
                *into++ = *json++;
            }
            *into++ = *json++;
        } // string literals, which are \" sensitive.
        else
            *into++ = *json++; // All other characters.
    }
    *into = 0; // and null-terminate.
}